

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetLite
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  bool bVar1;
  uint32_t tag;
  FieldSkipper *field_skipper_local;
  ExtensionFinder *extension_finder_local;
  CodedInputStream *input_local;
  ExtensionSet *this_local;
  uint32_t local_1c;
  uint32_t v;
  uint32_t local_c;
  
  while( true ) {
    local_1c = 0;
    if ((input->buffer_ < input->buffer_end_) &&
       (local_1c = (uint32_t)*input->buffer_, local_1c < 0x80)) {
      io::CodedInputStream::Advance(input,1);
      local_c = local_1c;
    }
    else {
      local_c = io::CodedInputStream::ReadTagFallback(input,local_1c);
    }
    input->last_tag_ = local_c;
    if (local_c == 0) break;
    if (local_c == 0xb) {
      bVar1 = ParseMessageSetItemLite(this,input,extension_finder,field_skipper);
      if (!bVar1) {
        return false;
      }
    }
    else {
      bVar1 = ParseField(this,local_c,input,extension_finder,field_skipper);
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool ExtensionSet::ParseMessageSetLite(io::CodedInputStream* input,
                                       ExtensionFinder* extension_finder,
                                       FieldSkipper* field_skipper) {
  while (true) {
    const uint32_t tag = input->ReadTag();
    switch (tag) {
      case 0:
        return true;
      case WireFormatLite::kMessageSetItemStartTag:
        if (!ParseMessageSetItemLite(input, extension_finder, field_skipper)) {
          return false;
        }
        break;
      default:
        if (!ParseField(tag, input, extension_finder, field_skipper)) {
          return false;
        }
        break;
    }
  }
}